

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O3

int file_free(archive *a,void *client_data)

{
  write_fd_data *mine;
  
  if (client_data != (void *)0x0) {
    free(client_data);
  }
  return 0;
}

Assistant:

static int
file_free(struct archive *a, void *client_data)
{
	struct write_file_data	*mine = (struct write_file_data *)client_data;

	(void)a; /* UNUSED */

	if (mine == NULL)
		return (ARCHIVE_OK);

	archive_mstring_clean(&mine->filename);
	free(mine);
	return (ARCHIVE_OK);
}